

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

bool __thiscall
vkb::detail::VulkanFunctions::init_vulkan_funcs
          (VulkanFunctions *this,PFN_vkGetInstanceProcAddr fp_vkGetInstanceProcAddr)

{
  bool bVar1;
  int iVar2;
  PFN_vkEnumerateInstanceExtensionProperties p_Var3;
  PFN_vkEnumerateInstanceLayerProperties p_Var4;
  PFN_vkEnumerateInstanceVersion p_Var5;
  PFN_vkCreateInstance p_Var6;
  undefined8 uVar7;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 != 0) {
    uVar7 = std::__throw_system_error(iVar2);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    _Unwind_Resume(uVar7);
  }
  if (fp_vkGetInstanceProcAddr == (PFN_vkGetInstanceProcAddr)0x0) {
    bVar1 = load_vulkan_library(this);
    if (!bVar1) {
      bVar1 = false;
      goto LAB_0010c787;
    }
  }
  else {
    this->ptr_vkGetInstanceProcAddr = fp_vkGetInstanceProcAddr;
  }
  p_Var3 = (PFN_vkEnumerateInstanceExtensionProperties)
           (*this->ptr_vkGetInstanceProcAddr)
                     ((VkInstance)0x0,"vkEnumerateInstanceExtensionProperties");
  this->fp_vkEnumerateInstanceExtensionProperties = p_Var3;
  p_Var4 = (PFN_vkEnumerateInstanceLayerProperties)
           (*this->ptr_vkGetInstanceProcAddr)((VkInstance)0x0,"vkEnumerateInstanceLayerProperties");
  this->fp_vkEnumerateInstanceLayerProperties = p_Var4;
  p_Var5 = (PFN_vkEnumerateInstanceVersion)
           (*this->ptr_vkGetInstanceProcAddr)((VkInstance)0x0,"vkEnumerateInstanceVersion");
  this->fp_vkEnumerateInstanceVersion = p_Var5;
  p_Var6 = (PFN_vkCreateInstance)
           (*this->ptr_vkGetInstanceProcAddr)((VkInstance)0x0,"vkCreateInstance");
  this->fp_vkCreateInstance = p_Var6;
  bVar1 = true;
LAB_0010c787:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return bVar1;
}

Assistant:

bool init_vulkan_funcs(PFN_vkGetInstanceProcAddr fp_vkGetInstanceProcAddr = nullptr) {
        std::lock_guard<std::mutex> lg(init_mutex);
        if (fp_vkGetInstanceProcAddr != nullptr) {
            ptr_vkGetInstanceProcAddr = fp_vkGetInstanceProcAddr;
        } else {
            bool ret = load_vulkan_library();
            if (!ret) return false;
        }

        fp_vkEnumerateInstanceExtensionProperties = reinterpret_cast<PFN_vkEnumerateInstanceExtensionProperties>(
            ptr_vkGetInstanceProcAddr(VK_NULL_HANDLE, "vkEnumerateInstanceExtensionProperties"));
        fp_vkEnumerateInstanceLayerProperties = reinterpret_cast<PFN_vkEnumerateInstanceLayerProperties>(
            ptr_vkGetInstanceProcAddr(VK_NULL_HANDLE, "vkEnumerateInstanceLayerProperties"));
        fp_vkEnumerateInstanceVersion = reinterpret_cast<PFN_vkEnumerateInstanceVersion>(
            ptr_vkGetInstanceProcAddr(VK_NULL_HANDLE, "vkEnumerateInstanceVersion"));
        fp_vkCreateInstance =
            reinterpret_cast<PFN_vkCreateInstance>(ptr_vkGetInstanceProcAddr(VK_NULL_HANDLE, "vkCreateInstance"));
        return true;
    }